

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
                 (FieldDescriptor *field,Message *message)

{
  MapKey *pMVar1;
  FieldDescriptor *field_00;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  Type TVar6;
  undefined4 extraout_var;
  MapFieldBase *this;
  Descriptor *pDVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  long *plVar12;
  long *plVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  MapIterator iter;
  MapIterator end;
  MapIterator local_90;
  MapIterator local_60;
  
  iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar13 = (long *)CONCAT44(extraout_var,iVar4);
  bVar2 = FieldDescriptor::is_map(field);
  if (bVar2) {
    this = (MapFieldBase *)(**(code **)(*plVar13 + 0x2d8))(plVar13,message,field);
    bVar2 = MapFieldBase::IsMapValid(this);
    if (bVar2) {
      MapIterator::MapIterator(&local_90,message,field);
      MapIterator::MapIterator(&local_60,message,field);
      pDVar7 = FieldDescriptor::message_type(field);
      field_00 = *(FieldDescriptor **)(pDVar7 + 0x30);
      pDVar7 = FieldDescriptor::message_type(field);
      lVar10 = *(long *)(pDVar7 + 0x30);
      (*this->_vptr_MapFieldBase[6])(this,&local_90);
      (*this->_vptr_MapFieldBase[7])(this,&local_60);
      sVar14 = 0;
      while (iVar4 = (*(local_90.map_)->_vptr_MapFieldBase[5])(local_90.map_,&local_90,&local_60),
            (char)iVar4 == '\0') {
        sVar8 = MapKeyDataOnlyByteSize(field_00,&local_90.key_);
        sVar9 = MapValueRefDataOnlyByteSize((FieldDescriptor *)(lVar10 + 0xa8),&local_90.value_);
        uVar5 = (int)sVar9 + (int)sVar8 + 2U | 1;
        iVar4 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar14 = sVar14 + sVar8 + sVar9 + 2 + (ulong)(iVar4 * 9 + 0x49U >> 6);
        (*(local_90.map_)->_vptr_MapFieldBase[0xf])(local_90.map_,&local_90);
      }
      MapIterator::~MapIterator(&local_60);
      MapIterator::~MapIterator(&local_90);
    }
    else {
      sVar14 = 0;
    }
    if (bVar2) {
      return sVar14;
    }
  }
  else {
    sVar14 = 0;
  }
  if (*(int *)(field + 0x4c) == 3) {
    uVar5 = (**(code **)(*plVar13 + 0x30))(plVar13,message,field);
    uVar16 = (ulong)uVar5;
  }
  else {
    uVar16 = 1;
    if (*(char *)(*(long *)(*(long *)(field + 0x58) + 0x20) + 0x6b) == '\0') {
      bVar3 = (**(code **)(*plVar13 + 0x28))(plVar13,message,field);
      uVar16 = (ulong)bVar3;
    }
  }
  TVar6 = FieldDescriptor::type(field);
  switch(TVar6) {
  case TYPE_DOUBLE:
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
    sVar14 = sVar14 + uVar16 * 8;
    break;
  case TYPE_FLOAT:
  case TYPE_FIXED32:
  case TYPE_SFIXED32:
    sVar14 = sVar14 + uVar16 * 4;
    break;
  case TYPE_INT64:
    if (*(int *)(field + 0x4c) == 3) {
      if (uVar16 == 0) {
        return sVar14;
      }
      uVar15 = 0;
      do {
        uVar11 = (**(code **)(*plVar13 + 0x158))(plVar13,message,field,uVar15 & 0xffffffff);
        lVar10 = 0x3f;
        if ((uVar11 | 1) != 0) {
          for (; (uVar11 | 1) >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar10 * 9 + 0x49U >> 6);
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
      return sVar14;
    }
    uVar16 = (**(code **)(*plVar13 + 0x90))(plVar13,message,field);
    goto LAB_0034126f;
  case TYPE_UINT64:
    if (*(int *)(field + 0x4c) == 3) {
      if (uVar16 == 0) {
        return sVar14;
      }
      uVar15 = 0;
      do {
        uVar11 = (**(code **)(*plVar13 + 0x168))(plVar13,message,field,uVar15 & 0xffffffff);
        lVar10 = 0x3f;
        if ((uVar11 | 1) != 0) {
          for (; (uVar11 | 1) >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar10 * 9 + 0x49U >> 6);
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
      return sVar14;
    }
    uVar16 = (**(code **)(*plVar13 + 0xa0))(plVar13,message,field);
    goto LAB_0034126f;
  case TYPE_INT32:
    if (*(int *)(field + 0x4c) == 3) {
      if (uVar16 == 0) {
        return sVar14;
      }
      uVar15 = 0;
      do {
        uVar5 = (**(code **)(*plVar13 + 0x150))(plVar13,message,field,uVar15 & 0xffffffff);
        if ((int)uVar5 < 0) {
          uVar11 = 10;
        }
        else {
          iVar4 = 0x1f;
          if ((uVar5 | 1) != 0) {
            for (; (uVar5 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          uVar11 = (ulong)(iVar4 * 9 + 0x49U >> 6);
        }
        sVar14 = sVar14 + uVar11;
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
      return sVar14;
    }
    uVar16 = (**(code **)(*plVar13 + 0x88))(plVar13,message,field);
    goto LAB_00341212;
  case TYPE_BOOL:
    sVar14 = sVar14 + uVar16;
    break;
  case TYPE_STRING:
  case TYPE_BYTES:
    if (uVar16 != 0) {
      pMVar1 = &local_90.key_;
      uVar15 = 0;
      do {
        local_90.map_ = (MapFieldBase *)0x0;
        local_90.key_.val_.bool_value_ = false;
        local_90.iter_ = pMVar1;
        if (*(int *)(field + 0x4c) == 3) {
          lVar10 = (**(code **)(*plVar13 + 0x1a8))
                             (plVar13,message,field,uVar15 & 0xffffffff,&local_90);
        }
        else {
          lVar10 = (**(code **)(*plVar13 + 0xe0))(plVar13,message,field,&local_90);
        }
        lVar10 = *(long *)(lVar10 + 8);
        if ((MapKey *)local_90.iter_ != pMVar1) {
          operator_delete(local_90.iter_,
                          CONCAT71(local_90.key_.val_.int64_value_._1_7_,
                                   local_90.key_.val_.bool_value_) + 1);
        }
        uVar5 = (uint)lVar10 | 1;
        iVar4 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar14 = sVar14 + lVar10 + (ulong)(iVar4 * 9 + 0x49U >> 6);
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
    }
    break;
  case TYPE_GROUP:
    if (*(int *)(field + 0x4c) == 3) {
      if (uVar16 == 0) {
        return sVar14;
      }
      uVar15 = 0;
      do {
        plVar12 = (long *)(**(code **)(*plVar13 + 0x1a0))(plVar13,message,field,uVar15 & 0xffffffff)
        ;
        lVar10 = (**(code **)(*plVar12 + 0x60))(plVar12);
        sVar14 = sVar14 + lVar10;
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
      return sVar14;
    }
    plVar13 = (long *)(**(code **)(*plVar13 + 0xd8))(plVar13,message,field,0);
    uVar16 = (**(code **)(*plVar13 + 0x60))(plVar13);
    goto LAB_003412aa;
  case TYPE_MESSAGE:
    if (*(int *)(field + 0x4c) == 3) {
      if (uVar16 == 0) {
        return sVar14;
      }
      uVar15 = 0;
      do {
        plVar12 = (long *)(**(code **)(*plVar13 + 0x1a0))(plVar13,message,field,uVar15 & 0xffffffff)
        ;
        lVar10 = (**(code **)(*plVar12 + 0x60))(plVar12);
        uVar5 = (uint)lVar10 | 1;
        iVar4 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar14 = sVar14 + lVar10 + (ulong)(iVar4 * 9 + 0x49U >> 6);
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
      return sVar14;
    }
    plVar13 = (long *)(**(code **)(*plVar13 + 0xd8))(plVar13,message,field,0);
    uVar16 = (**(code **)(*plVar13 + 0x60))(plVar13);
    sVar14 = sVar14 + uVar16;
    goto LAB_0034129b;
  case TYPE_UINT32:
    if (*(int *)(field + 0x4c) == 3) {
      if (uVar16 == 0) {
        return sVar14;
      }
      uVar15 = 0;
      do {
        uVar5 = (**(code **)(*plVar13 + 0x160))(plVar13,message,field,uVar15 & 0xffffffff);
        iVar4 = 0x1f;
        if ((uVar5 | 1) != 0) {
          for (; (uVar5 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar14 = sVar14 + (iVar4 * 9 + 0x49U >> 6);
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
      return sVar14;
    }
    uVar16 = (**(code **)(*plVar13 + 0x98))(plVar13,message,field);
LAB_0034129b:
    uVar5 = (uint)uVar16 | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    goto LAB_003412a1;
  case TYPE_ENUM:
    if (*(int *)(field + 0x4c) == 3) {
      if (uVar16 == 0) {
        return sVar14;
      }
      uVar15 = 0;
      do {
        lVar10 = (**(code **)(*plVar13 + 400))(plVar13,message,field,uVar15 & 0xffffffff);
        if ((int)*(uint *)(lVar10 + 0x10) < 0) {
          uVar11 = 10;
        }
        else {
          uVar5 = *(uint *)(lVar10 + 0x10) | 1;
          iVar4 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          uVar11 = (ulong)(iVar4 * 9 + 0x49U >> 6);
        }
        sVar14 = sVar14 + uVar11;
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
      return sVar14;
    }
    lVar10 = (**(code **)(*plVar13 + 200))(plVar13,message,field);
    uVar16 = (ulong)*(uint *)(lVar10 + 0x10);
LAB_00341212:
    if (-1 < (int)uVar16) goto LAB_0034129b;
    uVar16 = 10;
    goto LAB_003412aa;
  case TYPE_SINT32:
    if (*(int *)(field + 0x4c) == 3) {
      if (uVar16 == 0) {
        return sVar14;
      }
      uVar15 = 0;
      do {
        iVar4 = (**(code **)(*plVar13 + 0x150))(plVar13,message,field,uVar15 & 0xffffffff);
        uVar5 = iVar4 >> 0x1f ^ iVar4 * 2 | 1;
        iVar4 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar14 = sVar14 + (iVar4 * 9 + 0x49U >> 6);
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
      return sVar14;
    }
    iVar4 = (**(code **)(*plVar13 + 0x88))(plVar13,message,field);
    uVar5 = iVar4 >> 0x1f ^ iVar4 * 2 | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    goto LAB_003412a1;
  case MAX_TYPE:
    if (*(int *)(field + 0x4c) == 3) {
      if (uVar16 == 0) {
        return sVar14;
      }
      uVar15 = 0;
      do {
        lVar10 = (**(code **)(*plVar13 + 0x158))(plVar13,message,field,uVar15 & 0xffffffff);
        uVar11 = lVar10 >> 0x3f ^ lVar10 * 2 | 1;
        lVar10 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar10 * 9 + 0x49U >> 6);
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
      return sVar14;
    }
    lVar10 = (**(code **)(*plVar13 + 0x90))(plVar13,message,field);
    uVar16 = lVar10 >> 0x3f ^ lVar10 * 2;
LAB_0034126f:
    lVar10 = 0x3f;
    if ((uVar16 | 1) != 0) {
      for (; (uVar16 | 1) >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    iVar4 = (int)lVar10;
LAB_003412a1:
    uVar16 = (ulong)(iVar4 * 9 + 0x49U >> 6);
LAB_003412aa:
    sVar14 = sVar14 + uVar16;
  }
  return sVar14;
}

Assistant:

size_t WireFormat::FieldDataOnlyByteSize(
    const FieldDescriptor* field,
    const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t data_size = 0;

  if (field->is_map()) {
    MapFieldBase* map_field =
        message_reflection->MapData(const_cast<Message*>(&message), field);
    if (map_field->IsMapValid()) {
      MapIterator iter(const_cast<Message*>(&message), field);
      MapIterator end(const_cast<Message*>(&message), field);
      const FieldDescriptor* key_field = field->message_type()->field(0);
      const FieldDescriptor* value_field = field->message_type()->field(1);
      for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
           ++iter) {
        size_t size = kMapEntryTagByteSize;
        size += MapKeyDataOnlyByteSize(key_field, iter.GetKey());
        size += MapValueRefDataOnlyByteSize(value_field, iter.GetValueRef());
        data_size += WireFormatLite::LengthDelimitedSize(size);
      }
      return data_size;
    }
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count =
        internal::FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                     \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      if (field->is_repeated()) {                                          \
        for (int j = 0; j < count; j++) {                                  \
          data_size += WireFormatLite::TYPE_METHOD##Size(                  \
            message_reflection->GetRepeated##CPPTYPE_METHOD(               \
              message, field, j));                                         \
        }                                                                  \
      } else {                                                             \
        data_size += WireFormatLite::TYPE_METHOD##Size(                    \
          message_reflection->Get##CPPTYPE_METHOD(message, field));        \
      }                                                                    \
      break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                               \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      data_size += count * WireFormatLite::k##TYPE_METHOD##Size;           \
      break;

    HANDLE_TYPE( INT32,  Int32,  Int32)
    HANDLE_TYPE( INT64,  Int64,  Int64)
    HANDLE_TYPE(SINT32, SInt32,  Int32)
    HANDLE_TYPE(SINT64, SInt64,  Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE( FIXED32,  Fixed32)
    HANDLE_FIXED_TYPE( FIXED64,  Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT , Float )
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP  , Group  , Message)
    HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (int j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
            message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
          message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      for (int j = 0; j < count; j++) {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}